

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebraReasoning.cpp
# Opt level: O0

_ElementType __thiscall
Inferences::AcyclicityGIE1::SubtermDisequalityIterator::next(SubtermDisequalityIterator *this)

{
  Clause *pCVar1;
  GeneratingInference1 *in_RDI;
  Inference *in_stack_00000008;
  Literal *in_stack_00000010;
  Literal *in_stack_00000018;
  Clause *in_stack_00000020;
  Clause *res;
  Literal *newlit;
  Inference *this_00;
  undefined1 in_stack_ffffffffffffff9f;
  TermList in_stack_ffffffffffffffa0;
  TermList in_stack_ffffffffffffffa8;
  TermList in_stack_ffffffffffffffb0;
  
  Kernel::Term::nthArgument((Term *)in_RDI->premise,(byte)~in_RDI[3].rule & 1);
  Lib::Stack<Kernel::TermList_*>::pop((Stack<Kernel::TermList_*> *)(in_RDI + 1));
  Kernel::Literal::createEquality
            ((bool)in_stack_ffffffffffffff9f,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
  this_00 = (Inference *)&stack0xffffffffffffff90;
  Kernel::GeneratingInference1::GeneratingInference1
            ((GeneratingInference1 *)this_00,TERM_ALGEBRA_ACYCLICITY,*(Clause **)in_RDI);
  Kernel::Inference::Inference(this_00,in_RDI);
  pCVar1 = replaceLit(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
  Kernel::Inference::~Inference((Inference *)&stack0xffffffffffffffa0);
  *(int *)(DAT_01333840 + 0x1cc) = *(int *)(DAT_01333840 + 0x1cc) + 1;
  return pCVar1;
}

Assistant:

OWN_ELEMENT_TYPE next()
    {
      Literal *newlit = Literal::createEquality(false,
                                                *_lit->nthArgument(_leftSide ? 0 : 1),
                                                *_subterms.pop(),
                                                _sort);
      Clause* res = replaceLit(_clause, _lit, newlit, GeneratingInference1(InferenceRule::TERM_ALGEBRA_ACYCLICITY, _clause));
      env.statistics->taAcyclicityGeneratedDisequalities++;
      return res;
    }